

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_FindAboveIntersectors(AActor *actor)

{
  FPortalGroupArray *this;
  int iVar1;
  bool bVar2;
  uint uVar3;
  Self *other;
  Self *other_00;
  double dVar4;
  double dVar5;
  TFlags<ActorFlag3,_unsigned_int> local_250;
  TFlags<ActorFlag3,_unsigned_int> local_24c;
  TFlags<ActorFlag3,_unsigned_int> local_248;
  TFlags<ActorFlag2,_unsigned_int> local_244;
  TFlags<ActorFlag2,_unsigned_int> local_240;
  TFlags<ActorFlag2,_unsigned_int> local_23c;
  TFlags<ActorFlag,_unsigned_int> local_238;
  TFlags<ActorFlag,_unsigned_int> local_234;
  TFlags<ActorFlag,_unsigned_int> local_230;
  TFlags<ActorFlag,_unsigned_int> local_22c;
  double local_228;
  double blockdist;
  AActor *thing;
  CheckResult cres;
  undefined1 local_1e0 [8];
  FMultiBlockThingsIterator it;
  FPortalGroupArray check;
  AActor *actor_local;
  
  iVar1 = (int)actor;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)&check.data.Count,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&check.data.Count);
  if (uVar3 == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)&check.data.Most,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&check.data.Most);
    if (uVar3 != 0) {
      this = (FPortalGroupArray *)(it.bbox.m_Box + 3);
      FPortalGroupArray::FPortalGroupArray(this,1);
      FMultiBlockThingsIterator::FMultiBlockThingsIterator
                ((FMultiBlockThingsIterator *)local_1e0,this,actor,-1.0,false);
      FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&thing);
LAB_0058f758:
      bVar2 = FMultiBlockThingsIterator::Next
                        ((FMultiBlockThingsIterator *)local_1e0,(CheckResult *)&thing);
      if (bVar2) {
        blockdist = (double)thing;
        local_228 = actor->radius + thing->radius;
        dVar4 = AActor::X(thing);
        if ((ABS(dVar4 - (double)cres.thing) < local_228) &&
           (dVar4 = AActor::Y((AActor *)blockdist), ABS(dVar4 - cres.Position.X) < local_228)) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_22c,
                     SUB84(blockdist,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_22c);
          if (uVar3 != 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_230,
                       SUB84(blockdist,0) +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
            uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_230);
            if (uVar3 == 0) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_234,
                         SUB84(blockdist,0) +
                         (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_234);
              if (uVar3 != 0) {
                TFlags<ActorFlag,_unsigned_int>::operator&
                          (&local_238,
                           iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                    MF_NOSECTOR|MF_SHOOTABLE));
                uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_238);
                if (uVar3 == 0) goto LAB_0058f758;
              }
              if ((AActor *)blockdist != actor) {
                other = (Self *)((long)blockdist + 0x1c0);
                TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_244,&actor->flags2);
                TFlags<ActorFlag2,_unsigned_int>::operator|(&local_240,other);
                TFlags<ActorFlag2,_unsigned_int>::operator&(&local_23c,(ActorFlag2)&local_240);
                uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_23c);
                bVar2 = false;
                if (uVar3 == 0) {
                  other_00 = (Self *)((long)blockdist + 0x1c4);
                  TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_250,&actor->flags3);
                  TFlags<ActorFlag3,_unsigned_int>::operator|(&local_24c,other_00);
                  TFlags<ActorFlag3,_unsigned_int>::operator&(&local_248,(ActorFlag3)&local_24c);
                  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_248);
                  bVar2 = uVar3 == 0;
                }
                if (!bVar2) {
                  dVar4 = AActor::Z((AActor *)blockdist);
                  dVar5 = AActor::Z(actor);
                  if (dVar5 < dVar4) {
                    dVar4 = AActor::Z((AActor *)blockdist);
                    dVar5 = AActor::Top(actor);
                    if (dVar4 <= dVar5) {
                      TArray<AActor_*,_AActor_*>::Push(&intersectors,(AActor **)&blockdist);
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0058f758;
      }
      FMultiBlockThingsIterator::~FMultiBlockThingsIterator((FMultiBlockThingsIterator *)local_1e0);
      FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(it.bbox.m_Box + 3));
    }
  }
  return;
}

Assistant:

void P_FindAboveIntersectors(AActor *actor)
{
	if (actor->flags & MF_NOCLIP)
		return;

	if (!(actor->flags & MF_SOLID))
		return;

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, actor);
	FMultiBlockThingsIterator::CheckResult cres;
	while (it.Next(&cres))
	{
		AActor *thing = cres.thing;
		double blockdist = actor->radius + thing->radius;
		if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
			continue;

		if (!(thing->flags & MF_SOLID))
		{ // Can't hit thing
			continue;
		}
		if (thing->flags & (MF_SPECIAL))
		{ // [RH] Corpses and specials don't block moves
			continue;
		}
		if (thing->flags & (MF_CORPSE))
		{ // Corpses need a few more checks
			if (!(actor->flags & MF_ICECORPSE))
				continue;
		}
		if (thing == actor)
		{ // Don't clip against self
			continue;
		}
		if (!((thing->flags2 | actor->flags2) & MF2_PASSMOBJ) && !((thing->flags3 | actor->flags3) & MF3_ISMONSTER))
		{
			// Don't bother if both things don't have MF2_PASSMOBJ set and aren't monsters.
			// These things would always block each other which in nearly every situation is 
			// not what is wanted here.
			continue;
		}
		if (thing->Z() > actor->Z() &&
			thing->Z() <= actor->Top())
		{ // Thing intersects above the base
			intersectors.Push(thing);
		}
	}
}